

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_dataview_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  JSValue val;
  JSValue val_00;
  JSValue ctor;
  long lVar1;
  int iVar2;
  JSContext *ctx_00;
  void *pvVar3;
  int in_ECX;
  JSContext *in_RDI;
  JSValue *in_R8;
  JSValue JVar4;
  JSValue JVar5;
  uint64_t l;
  JSObject *p;
  JSTypedArray *ta;
  JSValue obj;
  JSValue buffer;
  uint32_t len;
  uint64_t offset;
  JSArrayBuffer *abuf;
  JSContext *in_stack_ffffffffffffff48;
  JSValueUnion in_stack_ffffffffffffff58;
  JSValueUnion in_stack_ffffffffffffff60;
  JSContext *in_stack_ffffffffffffff68;
  JSValueUnion JVar6;
  JSValueUnion ctx_01;
  JSValueUnion in_stack_ffffffffffffff70;
  ulong in_stack_ffffffffffffff78;
  uint local_4c;
  undefined4 in_stack_ffffffffffffffd0;
  JSValueUnion local_10;
  int64_t local_8;
  
  JVar5 = *in_R8;
  JVar4.tag = (int64_t)in_stack_ffffffffffffff68;
  JVar4.u.ptr = in_stack_ffffffffffffff60.ptr;
  ctx_00 = (JSContext *)js_get_array_buffer((JSContext *)in_stack_ffffffffffffff58.ptr,JVar4);
  lVar1 = local_10;
  if (ctx_00 == (JSContext *)0x0) {
    local_10.ptr = (void *)(lVar1 << 0x20);
    local_8 = 6;
  }
  else if ((in_ECX < 2) ||
          (val.tag = in_stack_ffffffffffffff78, val.u.ptr = in_stack_ffffffffffffff70.ptr,
          iVar2 = JS_ToIndex(in_stack_ffffffffffffff68,(uint64_t *)in_stack_ffffffffffffff60.ptr,val
                            ), iVar2 == 0)) {
    if ((ctx_00->header).field_0x4 == '\0') {
      local_4c = (ctx_00->header).ref_count;
      if ((2 < in_ECX) && (iVar2 = JS_IsUndefined(in_R8[2]), iVar2 == 0)) {
        val_00.tag = in_stack_ffffffffffffff78;
        val_00.u.ptr = in_stack_ffffffffffffff70.ptr;
        iVar2 = JS_ToIndex(in_stack_ffffffffffffff68,(uint64_t *)in_stack_ffffffffffffff60.ptr,
                           val_00);
        if (iVar2 != 0) {
          local_10.ptr = (void *)(lVar1 << 0x20);
          local_8 = 6;
          return _local_10;
        }
        if (local_4c < in_stack_ffffffffffffff78) {
          JVar4 = JS_ThrowRangeError(in_RDI,"invalid byteLength");
          return JVar4;
        }
        local_4c = (uint)in_stack_ffffffffffffff78;
      }
      ctor.tag._0_4_ = in_stack_ffffffffffffffd0;
      ctor.u.ptr = in_R8;
      ctor.tag._4_4_ = in_ECX;
      JVar4 = js_create_from_ctor(ctx_00,ctor,0);
      JVar6 = JVar4.u;
      ctx_01 = JVar6;
      iVar2 = JS_IsException(JVar4);
      if (iVar2 == 0) {
        if ((ctx_00->header).field_0x4 == '\0') {
          pvVar3 = js_malloc(ctx_01.ptr,in_stack_ffffffffffffff60.ptr);
          if (pvVar3 != (void *)0x0) {
            ((JSValueUnion *)((long)pvVar3 + 0x10))->ptr = (void *)JVar6;
            JVar5 = JS_DupValue(in_RDI,JVar5);
            ((JSValueUnion *)((long)pvVar3 + 0x18))->ptr = (void *)JVar5.u;
            *(undefined4 *)((long)pvVar3 + 0x20) = 0;
            *(uint *)((long)pvVar3 + 0x24) = local_4c;
            list_add_tail((list_head *)JVar5.tag,(list_head *)JVar5.u.ptr);
            *(void **)((long)JVar6.ptr + 0x30) = pvVar3;
            return JVar4;
          }
        }
        else {
          JVar4 = JS_ThrowTypeErrorDetachedArrayBuffer((JSContext *)0x150f73);
          in_stack_ffffffffffffff58 = JVar4.u;
          in_stack_ffffffffffffff60 = (JSValueUnion)JVar4.tag;
        }
        JVar5.tag = (int64_t)in_stack_ffffffffffffff60.ptr;
        JVar5.u.float64 = in_stack_ffffffffffffff58.float64;
        JS_FreeValue(in_stack_ffffffffffffff48,JVar5);
        local_10.ptr = (void *)(lVar1 << 0x20);
        local_8 = 6;
      }
      else {
        local_10.ptr = (void *)(lVar1 << 0x20);
        local_8 = 6;
      }
    }
    else {
      _local_10 = JS_ThrowTypeErrorDetachedArrayBuffer((JSContext *)0x150dd7);
    }
  }
  else {
    local_10.ptr = (void *)(lVar1 << 0x20);
    local_8 = 6;
  }
  return _local_10;
}

Assistant:

static JSValue js_dataview_constructor(JSContext *ctx,
                                       JSValueConst new_target,
                                       int argc, JSValueConst *argv)
{
    JSArrayBuffer *abuf;
    uint64_t offset;
    uint32_t len;
    JSValueConst buffer;
    JSValue obj;
    JSTypedArray *ta;
    JSObject *p;

    buffer = argv[0];
    abuf = js_get_array_buffer(ctx, buffer);
    if (!abuf)
        return JS_EXCEPTION;
    offset = 0;
    if (argc > 1) {
        if (JS_ToIndex(ctx, &offset, argv[1]))
            return JS_EXCEPTION;
    }
    if (abuf->detached)
        return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
    if (offset > abuf->byte_length)
        return JS_ThrowRangeError(ctx, "invalid byteOffset");
    len = abuf->byte_length - offset;
    if (argc > 2 && !JS_IsUndefined(argv[2])) {
        uint64_t l;
        if (JS_ToIndex(ctx, &l, argv[2]))
            return JS_EXCEPTION;
        if (l > len)
            return JS_ThrowRangeError(ctx, "invalid byteLength");
        len = l;
    }

    obj = js_create_from_ctor(ctx, new_target, JS_CLASS_DATAVIEW);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    if (abuf->detached) {
        /* could have been detached in js_create_from_ctor() */
        JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        goto fail;
    }
    ta = js_malloc(ctx, sizeof(*ta));
    if (!ta) {
    fail:
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    p = JS_VALUE_GET_OBJ(obj);
    ta->obj = p;
    ta->buffer = JS_VALUE_GET_OBJ(JS_DupValue(ctx, buffer));
    ta->offset = offset;
    ta->length = len;
    list_add_tail(&ta->link, &abuf->array_list);
    p->u.typed_array = ta;
    return obj;
}